

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionFlowElementType,_0UL>::
         Construct(DB *db,LIST *params)

{
  IfcDistributionElementType *this;
  
  this = (IfcDistributionElementType *)operator_new(0x1b8);
  *(undefined ***)&this->field_0x1a0 = &PTR__Object_008ee2a0;
  *(undefined8 *)&this[1].super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject = 0;
  *(char **)&this[1].super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0x8 =
       "IfcDistributionFlowElementType";
  Assimp::IFC::Schema_2x3::IfcDistributionElementType::IfcDistributionElementType
            (this,&PTR_construction_vtable_24__008efb08);
  *(undefined ***)&(this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject =
       &PTR__IfcDistributionFlowElementType_008ef9d8;
  *(undefined ***)&this->field_0x1a0 = &PTR__IfcDistributionFlowElementType_008efaf0;
  *(undefined ***)&(this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject.field_0x88
       = &PTR__IfcDistributionFlowElementType_008efa00;
  (this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcDistributionFlowElementType_008efa28;
  *(undefined ***)&(this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject.field_0xf0
       = &PTR__IfcDistributionFlowElementType_008efa50;
  *(undefined ***)&(this->super_IfcElementType).super_IfcTypeProduct.field_0x148 =
       &PTR__IfcDistributionFlowElementType_008efa78;
  *(undefined ***)&(this->super_IfcElementType).field_0x180 =
       &PTR__IfcDistributionFlowElementType_008efaa0;
  *(undefined ***)&(this->super_IfcElementType).field_0x190 =
       &PTR__IfcDistributionFlowElementType_008efac8;
  GenericFill<Assimp::IFC::Schema_2x3::IfcObjectDefinition>(db,params,(IfcObjectDefinition *)this);
  return (Object *)
         (&(this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject.field_0x0 +
         *(long *)(*(long *)&(this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject +
                  -0x18));
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }